

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_ResizeHysteresis_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeHysteresis_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *psVar1;
  iterator iVar2;
  char *pcVar3;
  pointer ppcVar4;
  size_type old_bucket_count;
  AssertionResult gtest_ar_1;
  TypeParam ht;
  Hasher local_148;
  SetKey<const_char_*,_Identity> local_13a;
  Identity local_139;
  Hasher local_138;
  AssertHelperData *local_128;
  pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_120;
  undefined1 local_d0 [50];
  undefined1 local_9e;
  char *local_88;
  vector<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  local_78;
  AssertHelperData *local_40;
  
  pcVar3 = UniqueObjectHelper<char_const*>(1);
  psVar1 = &(this->
            super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ).
            super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_.
            super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(psVar1);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>
           + 0x2a) = true;
  (this->
  super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.
  super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey = pcVar3;
  local_128 = *(AssertHelperData **)
               ((long)&(this->
                       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       ).
                       super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       .ht_.
                       super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       .ht_.table.settings + 0x10);
  local_120.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(4);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(psVar1,1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_d0,psVar1,(const_reference)&local_120);
  local_d0._0_8_ = UniqueObjectHelper<char_const*>(4);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::erase(psVar1,(key_type *)local_d0);
  local_120.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(4);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(psVar1,1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_d0,psVar1,(const_reference)&local_120);
  local_d0._0_8_ = UniqueObjectHelper<char_const*>(4);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::erase(psVar1,(key_type *)local_d0);
  local_120.first.ht =
       *(sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         **)((long)&(this->
                    super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.table.settings + 0x10);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_d0,"old_bucket_count","this->ht_.bucket_count()",
             (unsigned_long *)&local_128,(unsigned_long *)&local_120);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_d0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar4 = (pointer)0xafc493;
    }
    else {
      ppcVar4 = *(pointer *)local_d0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x583,(char *)ppcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if (local_120.first.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_120.first.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
  }
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_d0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_d0._8_8_ !=
        &(((Settings *)(local_d0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_d0._8_8_);
    }
    operator_delete((void *)local_d0._8_8_);
  }
  local_148._0_8_ = (AssertHelperData *)0x0;
  local_148.num_compares_ = 0;
  local_138.id_ = 0;
  local_138.num_hashes_ = 0;
  local_138.num_compares_ = 0;
  local_120.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_120.first.ht & 0xffffffff00000000);
  local_120.first.pos.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  psVar1 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
            *)(local_d0 + 8);
  local_d0._0_8_ = &PTR__BaseHashtableInterface_00c26158;
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(psVar1,2,&local_148,&local_138,&local_139,&local_13a,
                     (Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> *)&local_120);
  local_d0._0_8_ = &PTR__BaseHashtableInterface_00c260d8;
  local_148._0_8_ = local_40;
  local_138.id_ = 0x20;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_int>
            ((internal *)&local_120,"ht.bucket_count()","32u",(unsigned_long *)&local_148,
             (uint *)&local_138);
  if ((char)local_120.first.ht == '\0') {
    testing::Message::Message((Message *)&local_148);
    if (local_120.first.pos.row_begin._M_current ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar4 = (pointer)0xafc493;
    }
    else {
      ppcVar4 = (local_120.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x587,(char *)ppcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_138,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    if ((AssertHelperData *)local_148._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_148._0_8_ + 8))();
    }
  }
  iVar2._M_current = local_120.first.pos.row_begin._M_current;
  if (local_120.first.pos.row_begin._M_current !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)(local_120.first.pos.row_begin._M_current)->group !=
        &((local_120.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_120.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar2._M_current);
  }
  pcVar3 = UniqueObjectHelper<char_const*>(1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(psVar1);
  local_9e = 1;
  local_128 = local_40;
  local_88 = pcVar3;
  local_148._0_8_ = UniqueObjectHelper<char_const*>(4);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(psVar1,1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize(&local_120,psVar1,(const_reference)&local_148);
  local_120.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(4);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::erase(psVar1,(key_type *)&local_120);
  local_148._0_8_ = UniqueObjectHelper<char_const*>(4);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(psVar1,1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize(&local_120,psVar1,(const_reference)&local_148);
  local_120.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(4);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::erase(psVar1,(key_type *)&local_120);
  local_148._0_8_ = local_40;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_120,"old_bucket_count","ht.bucket_count()",
             (unsigned_long *)&local_128,(unsigned_long *)&local_148);
  if ((char)local_120.first.ht == '\0') {
    testing::Message::Message((Message *)&local_148);
    if (local_120.first.pos.row_begin._M_current ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar4 = (pointer)0xafc493;
    }
    else {
      ppcVar4 = (local_120.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x58e,(char *)ppcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_138,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    if ((AssertHelperData *)local_148._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_148._0_8_ + 8))();
    }
  }
  iVar2._M_current = local_120.first.pos.row_begin._M_current;
  if (local_120.first.pos.row_begin._M_current !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)(local_120.first.pos.row_begin._M_current)->group !=
        &((local_120.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_120.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar2._M_current);
  }
  local_d0._0_8_ = &PTR__BaseHashtableInterface_00c26158;
  std::
  vector<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_78);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeHysteresis) {
  // We want to make sure that when we create a hashtable, and then
  // add and delete one element, the size of the hashtable doesn't
  // change.
  this->ht_.set_deleted_key(this->UniqueKey(1));
  typename TypeParam::size_type old_bucket_count = this->ht_.bucket_count();
  this->ht_.insert(this->UniqueObject(4));
  this->ht_.erase(this->UniqueKey(4));
  this->ht_.insert(this->UniqueObject(4));
  this->ht_.erase(this->UniqueKey(4));
  EXPECT_EQ(old_bucket_count, this->ht_.bucket_count());

  // Try it again, but with a hashtable that starts very small
  TypeParam ht(2);
  EXPECT_LT(ht.bucket_count(), 32u);  // verify we really do start small
  ht.set_deleted_key(this->UniqueKey(1));
  old_bucket_count = ht.bucket_count();
  ht.insert(this->UniqueObject(4));
  ht.erase(this->UniqueKey(4));
  ht.insert(this->UniqueObject(4));
  ht.erase(this->UniqueKey(4));
  EXPECT_EQ(old_bucket_count, ht.bucket_count());
}